

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O1

void __thiscall
gl4cts::anon_unknown_0::ComputeShaderBase::ComputeShaderBase(ComputeShaderBase *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int i;
  int iVar4;
  undefined4 extraout_var;
  long lVar6;
  Vector<float,_4> res;
  float local_48 [10];
  float afStack_20 [4];
  RenderTarget *pRVar5;
  
  deqp::SubcaseBase::SubcaseBase(&this->super_SubcaseBase);
  (this->super_SubcaseBase).super_GLWrapper._vptr_GLWrapper =
       (_func_int **)&PTR__SubcaseBase_02117d38;
  iVar4 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext
            [4])();
  pRVar5 = (RenderTarget *)CONCAT44(extraout_var,iVar4);
  this->renderTarget = pRVar5;
  this->pixelFormat = &pRVar5->m_pixelFormat;
  (this->g_color_eps).m_data[0] = 0.0;
  (this->g_color_eps).m_data[1] = 0.0;
  (this->g_color_eps).m_data[2] = 0.0;
  (this->g_color_eps).m_data[3] = 0.0;
  iVar4 = (pRVar5->m_pixelFormat).redBits;
  if (iVar4 == 0) {
LAB_009153d9:
    lVar6 = 0;
    do {
      local_48[lVar6 + 4] = 0.00012207031;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
  }
  else {
    iVar1 = (pRVar5->m_pixelFormat).greenBits;
    if (((iVar1 == 0) || (iVar2 = (pRVar5->m_pixelFormat).blueBits, iVar2 == 0)) ||
       (iVar3 = (pRVar5->m_pixelFormat).alphaBits, iVar3 == 0)) {
      if (((iVar4 == 0) || (iVar1 = (pRVar5->m_pixelFormat).greenBits, iVar1 == 0)) ||
         (iVar2 = (pRVar5->m_pixelFormat).blueBits, iVar2 == 0)) goto LAB_009153d9;
      local_48[0] = 1.0 / ((float)(1 << ((byte)iVar4 & 0x1f)) + -1.0);
      local_48[1] = 1.0 / ((float)(1 << ((byte)iVar1 & 0x1f)) + -1.0);
      local_48[2] = 1.0 / ((float)(1 << ((byte)iVar2 & 0x1f)) + -1.0);
      local_48[3] = 1.0;
      lVar6 = 0;
      do {
        afStack_20[lVar6] = 0.00012207031;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      local_48[4] = 0.0;
      local_48[5] = 0.0;
      local_48[6] = 0.0;
      local_48[7] = 0.0;
      lVar6 = 0;
      do {
        local_48[lVar6 + 4] = local_48[lVar6] + afStack_20[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
    }
    else {
      local_48[0] = 1.0 / ((float)(1 << ((byte)iVar4 & 0x1f)) + -1.0);
      local_48[1] = 1.0 / ((float)(1 << ((byte)iVar1 & 0x1f)) + -1.0);
      local_48[2] = 1.0 / ((float)(1 << ((byte)iVar2 & 0x1f)) + -1.0);
      local_48[3] = 1.0 / ((float)(1 << ((byte)iVar3 & 0x1f)) + -1.0);
      lVar6 = 0;
      do {
        afStack_20[lVar6] = 0.00012207031;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      local_48[4] = 0.0;
      local_48[5] = 0.0;
      local_48[6] = 0.0;
      local_48[7] = 0.0;
      lVar6 = 0;
      do {
        local_48[lVar6 + 4] = local_48[lVar6] + afStack_20[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
    }
  }
  (this->g_color_eps).m_data[0] = local_48[4];
  (this->g_color_eps).m_data[1] = local_48[5];
  (this->g_color_eps).m_data[2] = local_48[6];
  (this->g_color_eps).m_data[3] = local_48[7];
  return;
}

Assistant:

ComputeShaderBase()
		: renderTarget(m_context.getRenderContext().getRenderTarget()), pixelFormat(renderTarget.getPixelFormat())
	{
		float epsilon_zero = 1.f / (1 << 13);
		if (pixelFormat.redBits != 0 && pixelFormat.greenBits != 0 && pixelFormat.blueBits != 0 &&
			pixelFormat.alphaBits != 0)
		{
			g_color_eps = vec4(1.f / ((float)(1 << pixelFormat.redBits) - 1.0f),
							   1.f / ((float)(1 << pixelFormat.greenBits) - 1.0f),
							   1.f / ((float)(1 << pixelFormat.blueBits) - 1.0f),
							   1.f / ((float)(1 << pixelFormat.alphaBits) - 1.0f)) +
						  vec4(epsilon_zero);
		}
		else if (pixelFormat.redBits != 0 && pixelFormat.greenBits != 0 && pixelFormat.blueBits != 0)
		{
			g_color_eps = vec4(1.f / ((float)(1 << pixelFormat.redBits) - 1.0f),
							   1.f / ((float)(1 << pixelFormat.greenBits) - 1.0f),
							   1.f / ((float)(1 << pixelFormat.blueBits) - 1.0f), 1.f) +
						  vec4(epsilon_zero);
		}
		else
		{
			g_color_eps = vec4(epsilon_zero);
		}
	}